

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spp.cpp
# Opt level: O0

int __thiscall ncnn::SPP::forward(SPP *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int _h;
  int _w;
  bool bVar1;
  void *_data;
  float *pfVar2;
  Mat *in_RCX;
  Mat *in_RDX;
  Mat *in_RSI;
  long in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 uVar3;
  double dVar4;
  undefined8 extraout_XMM0_Qa_00;
  float val_1;
  int k_1;
  float sum;
  float *sptr_1;
  int j_2;
  int i_2;
  float *outptr_1;
  Mat m_1;
  int q_1;
  float val;
  int k;
  float max;
  float *sptr;
  int j_1;
  int i_1;
  float *outptr;
  Mat m;
  int q;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  Mat bottom_blob_bordered;
  int outh;
  int outw;
  int pad_w;
  int remainder_w;
  int stride_w;
  int kernel_w;
  int pad_h;
  int remainder_h;
  int stride_h;
  int kernel_h;
  int num_bins;
  int channels;
  int h;
  int w;
  int p;
  float *pyramid_ptr;
  int pyramid_num_bins;
  size_t elemsize;
  float in_stack_00000654;
  int in_stack_00000658;
  int in_stack_0000065c;
  int in_stack_00000660;
  int in_stack_00000664;
  Mat *in_stack_00000668;
  Mat *in_stack_00000670;
  int in_stack_00000680;
  Option *in_stack_00000688;
  Mat *in_stack_fffffffffffffd30;
  Mat *in_stack_fffffffffffffd38;
  allocator_type *in_stack_fffffffffffffd40;
  void *in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd50;
  int in_stack_fffffffffffffd54;
  int local_260;
  float local_25c;
  int local_250;
  int local_24c;
  float *local_248;
  Mat local_240;
  Mat local_200;
  int local_1c0;
  float local_1bc;
  int local_1b8;
  float local_1b4;
  float *local_1b0;
  int local_1a8;
  int local_1a4;
  float *local_1a0;
  Mat local_198;
  Mat local_158;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  reference local_100;
  vector<int,_std::allocator<int>_> local_f0;
  int local_d4;
  int local_d0;
  Mat local_c0;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  float *local_40;
  int local_34;
  size_t local_30;
  Mat *local_28;
  Mat *local_20;
  Mat *local_18;
  int local_4;
  
  local_30 = in_RSI->elemsize;
  local_34 = ((1 << ((byte)(*(int *)(in_RDI + 0x84) << 1) & 0x1f)) + -1) / 3;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
              (int)((ulong)in_stack_fffffffffffffd48 >> 0x20),(int)in_stack_fffffffffffffd48,
              (int)((ulong)in_stack_fffffffffffffd40 >> 0x20),(size_t)in_stack_fffffffffffffd38,
              (Allocator *)in_stack_fffffffffffffd30);
  bVar1 = Mat::empty(in_stack_fffffffffffffd30);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    local_40 = Mat::operator_cast_to_float_(local_20);
    uVar3 = extraout_XMM0_Qa;
    for (local_44 = 0; local_44 < *(int *)(in_RDI + 0x84); local_44 = local_44 + 1) {
      local_48 = local_18->w;
      local_4c = local_18->h;
      local_50 = local_18->c;
      local_54 = 1 << ((byte)local_44 & 0x1f);
      dVar4 = std::ceil((double)CONCAT44((int)((ulong)uVar3 >> 0x20),
                                         (float)local_4c / (float)local_54));
      local_5c = (int)SUB84(dVar4,0);
      local_60 = local_5c * local_54 - local_4c;
      local_64 = (local_60 + 1) / 2;
      local_58 = local_5c;
      dVar4 = std::ceil((double)CONCAT44((int)((ulong)dVar4 >> 0x20),
                                         (float)local_48 / (float)local_54));
      local_6c = (int)SUB84(dVar4,0);
      local_70 = local_6c * local_54 - local_48;
      local_74 = (local_70 + 1) / 2;
      local_78 = local_54;
      local_7c = local_54;
      local_68 = local_6c;
      Mat::Mat(&local_c0,local_18);
      if ((local_64 < 1) && (local_74 < 1)) {
LAB_0017d35e:
        local_d4 = local_58 * local_68;
        std::allocator<int>::allocator((allocator<int> *)0x17d395);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                   (size_type)in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
        std::allocator<int>::~allocator((allocator<int> *)0x17d3bb);
        local_100 = std::vector<int,_std::allocator<int>_>::operator[](&local_f0,0);
        local_104 = 0;
        local_108 = 0;
        local_10c = local_48 - local_68;
        for (local_110 = 0; local_110 < local_58; local_110 = local_110 + 1) {
          for (local_114 = 0; local_114 < local_68; local_114 = local_114 + 1) {
            local_100[local_104] = local_108;
            local_104 = local_104 + 1;
            local_108 = local_108 + 1;
          }
          local_108 = local_10c + local_108;
        }
        if (*(int *)(in_RDI + 0x80) == 0) {
          for (local_118 = 0; _w = local_48, _h = local_4c, local_118 < local_50;
              local_118 = local_118 + 1) {
            Mat::channel(in_stack_fffffffffffffd38,(int)((ulong)in_stack_fffffffffffffd30 >> 0x20));
            _data = Mat::operator_cast_to_void_(&local_198);
            Mat::Mat(&local_158,_w,_h,_data,4,(Allocator *)0x0);
            Mat::~Mat((Mat *)0x17d586);
            local_1a0 = local_40 + local_7c * local_78 * local_118;
            for (local_1a4 = 0; local_1a4 < local_7c; local_1a4 = local_1a4 + 1) {
              for (local_1a8 = 0; local_1a8 < local_78; local_1a8 = local_1a8 + 1) {
                local_1b0 = Mat::row(&local_158,local_1a4 * local_5c);
                local_1b0 = local_1b0 + local_1a8 * local_6c;
                local_1b4 = *local_1b0;
                for (local_1b8 = 0; local_1b8 < local_d4; local_1b8 = local_1b8 + 1) {
                  local_1bc = local_1b0[local_100[local_1b8]];
                  pfVar2 = std::max<float>(&local_1b4,&local_1bc);
                  local_1b4 = *pfVar2;
                }
                local_1a0[local_1a8] = local_1b4;
              }
              local_1a0 = local_1a0 + local_78;
            }
            Mat::~Mat((Mat *)0x17d7bc);
          }
        }
        else if (*(int *)(in_RDI + 0x80) == 1) {
          for (local_1c0 = 0; local_1c0 < local_50; local_1c0 = local_1c0 + 1) {
            in_stack_fffffffffffffd50 = local_48;
            in_stack_fffffffffffffd54 = local_4c;
            Mat::channel(in_stack_fffffffffffffd38,(int)((ulong)in_stack_fffffffffffffd30 >> 0x20));
            in_stack_fffffffffffffd48 = Mat::operator_cast_to_void_(&local_240);
            Mat::Mat(&local_200,in_stack_fffffffffffffd50,in_stack_fffffffffffffd54,
                     in_stack_fffffffffffffd48,4,(Allocator *)0x0);
            Mat::~Mat((Mat *)0x17d884);
            local_248 = local_40 + local_7c * local_78 * local_1c0;
            for (local_24c = 0; local_24c < local_7c; local_24c = local_24c + 1) {
              for (local_250 = 0; local_250 < local_78; local_250 = local_250 + 1) {
                in_stack_fffffffffffffd40 =
                     (allocator_type *)Mat::row(&local_200,local_24c * local_5c);
                local_25c = 0.0;
                for (local_260 = 0; local_260 < local_d4; local_260 = local_260 + 1) {
                  local_25c = *(float *)(in_stack_fffffffffffffd40 +
                                        (long)local_100[local_260] * 4 +
                                        (long)(local_250 * local_6c) * 4) + local_25c;
                }
                local_248[local_250] = local_25c / (float)local_d4;
              }
              local_248 = local_248 + local_78;
            }
            Mat::~Mat((Mat *)0x17da71);
          }
        }
        local_40 = local_40 + local_50 * local_7c * local_78;
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd40);
        local_d0 = 0;
      }
      else {
        in_stack_fffffffffffffd30 = local_28;
        copy_make_border(in_stack_00000670,in_stack_00000668,in_stack_00000664,in_stack_00000660,
                         in_stack_0000065c,in_stack_00000658,in_stack_00000680,in_stack_00000654,
                         in_stack_00000688);
        bVar1 = Mat::empty(in_stack_fffffffffffffd30);
        if (!bVar1) {
          local_48 = local_c0.w;
          local_4c = local_c0.h;
          goto LAB_0017d35e;
        }
        local_4 = -100;
        local_d0 = 1;
      }
      Mat::~Mat((Mat *)0x17dae1);
      if (local_d0 != 0) {
        return local_4;
      }
      uVar3 = extraout_XMM0_Qa_00;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int SPP::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    size_t elemsize = bottom_blob.elemsize;

    // 1 + 4 + 16 + 64 + ... + (2*pyramid_height)^2
    int pyramid_num_bins = ((1 << (pyramid_height * 2)) - 1) / 3;
    top_blob.create(pyramid_num_bins, 1, 2, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    float* pyramid_ptr = top_blob;

    // all spatial pyramids
    for (int p = 0; p < pyramid_height; p++)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int num_bins = 1 << p;

        int kernel_h = ceil(h / (float)num_bins);
        int stride_h = kernel_h;
        int remainder_h = stride_h * num_bins - h;
        int pad_h = (remainder_h + 1) / 2;

        int kernel_w = ceil(w / (float)num_bins);
        int stride_w = kernel_w;
        int remainder_w = stride_w * num_bins - w;
        int pad_w = (remainder_w + 1) / 2;

        // max value in NxN window
        // avg value in NxN window

        int outw = num_bins;
        int outh = num_bins;

        Mat bottom_blob_bordered = bottom_blob;
        if (pad_h > 0 || pad_w > 0)
        {
            copy_make_border(bottom_blob, bottom_blob_bordered, pad_h, pad_h, pad_w, pad_w, BORDER_CONSTANT, 0.f, opt);
            if (bottom_blob_bordered.empty())
                return -100;

            w = bottom_blob_bordered.w;
            h = bottom_blob_bordered.h;
        }

        const int maxk = kernel_h * kernel_w;

        // kernel offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - kernel_w;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const Mat m(w, h, bottom_blob_bordered.channel(q));
                float* outptr = pyramid_ptr + outh * outw * q;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i*stride_h) + j*stride_w;

                        float max = sptr[0];

                        for (int k = 0; k < maxk; k++)
                        {
                            float val = sptr[ space_ofs[k] ];
                            max = std::max(max, val);
                        }

                        outptr[j] = max;
                    }

                    outptr += outw;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const Mat m(w, h, bottom_blob_bordered.channel(q));
                float* outptr = pyramid_ptr + outh * outw * q;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i*stride_h) + j*stride_w;

                        float sum = 0;

                        for (int k = 0; k < maxk; k++)
                        {
                            float val = sptr[ space_ofs[k] ];
                            sum += val;
                        }

                        outptr[j] = sum / maxk;
                    }

                    outptr += outw;
                }
            }
        }

        pyramid_ptr += channels * outh * outw;
    }

    return 0;
}